

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::SceneLoader::end__scene(SceneLoader *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  UI_STRING *uis;
  UI *in_RSI;
  IFilePartLoader *in_RDI;
  bool success;
  bool local_9;
  
  local_9 = true;
  uVar2 = FilePartLoader::getObjectFlags((FilePartLoader *)0xb229fd);
  if ((uVar2 & 2) != 0) {
    iVar3 = IFilePartLoader::writer(in_RDI,in_RSI,uis);
    bVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                      ((long *)CONCAT44(extraout_var,iVar3),in_RDI[1].mPartLoader);
    local_9 = (bool)(bVar1 & 1);
  }
  if (in_RDI[1].mPartLoader != (IFilePartLoader *)0x0) {
    (*((in_RDI[1].mPartLoader)->super_ExtraDataLoader)._vptr_ExtraDataLoader[1])();
  }
  FilePartLoader::finish((FilePartLoader *)0xb22a50);
  return local_9;
}

Assistant:

bool SceneLoader::end__scene()
    {
        bool success = true;
		if ( (getObjectFlags() & Loader::SCENE_FLAG) != 0 )
		{
			success = writer()->writeScene ( mCurrentScene );
		}
        delete mCurrentScene;
        finish();
        return success;
    }